

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O2

void __thiscall
xemmai::t_slot_of<xemmai::t_type_of<xemmai::t_object>_>::f_construct
          (t_slot_of<xemmai::t_type_of<xemmai::t_object>_> *this,t_object *a_value)

{
  t_object *ptVar1;
  t_queue<128UL> *this_00;
  t_queue<256UL> *this_01;
  undefined8 *puVar2;
  
  this->v_p = (t_type_of<xemmai::t_object> *)a_value->v_data;
  if ((t_object *)0x4 < a_value) {
    puVar2 = (undefined8 *)__tls_get_addr(&PTR_00113e00);
    this_00 = (t_queue<128UL> *)*puVar2;
    *this_00->v_head = a_value;
    if (this_00->v_head == this_00->v_next) {
      t_slot::t_queue<128UL>::f_next(this_00);
    }
    else {
      this_00->v_head = this_00->v_head + 1;
    }
  }
  LOCK();
  ptVar1 = (this->v_slot).v_p._M_b._M_p;
  (this->v_slot).v_p._M_b._M_p = a_value;
  UNLOCK();
  if ((t_object *)0x4 < ptVar1) {
    puVar2 = (undefined8 *)__tls_get_addr(&PTR_00113e38);
    this_01 = (t_queue<256UL> *)*puVar2;
    *this_01->v_head = ptVar1;
    if (this_01->v_head == this_01->v_next) {
      t_slot::t_queue<256UL>::f_next(this_01);
      return;
    }
    this_01->v_head = this_01->v_head + 1;
  }
  return;
}

Assistant:

inline void t_slot_of<T>::f_construct(t_object* a_value)
{
	v_p = &a_value->f_as<T>();
	v_slot = a_value;
}